

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O1

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::~section_impl(section_impl<ELFIO::Elf64_Shdr> *this)

{
  pointer pcVar1;
  
  (this->super_section)._vptr_section = (_func_int **)&PTR__section_impl_00127588;
  if (this->data != (char *)0x0) {
    operator_delete__(this->data);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~section_impl()
    {
        delete [] data;
    }